

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetPrivate::emitItemCollapsed(QTreeWidgetPrivate *this,QModelIndex *index)

{
  QTreeWidgetPrivate *this_00;
  QTreeWidgetPrivate *in_RDI;
  QTreeWidget *q;
  
  this_00 = (QTreeWidgetPrivate *)q_func(in_RDI);
  item(this_00,(QModelIndex *)in_RDI);
  QTreeWidget::itemCollapsed((QTreeWidget *)0x916b7a,(QTreeWidgetItem *)in_RDI);
  return;
}

Assistant:

void QTreeWidgetPrivate::emitItemCollapsed(const QModelIndex &index)
{
    Q_Q(QTreeWidget);
    emit q->itemCollapsed(item(index));
}